

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestrategy.h
# Opt level: O1

void __thiscall
hedg::Base_Strategy::send_back_order
          (Base_Strategy *this,vector<hedg::Order,_std::allocator<hedg::Order>_> *orders)

{
  Client<hedg::Rest_Client> *this_00;
  pointer pcVar1;
  system_error e;
  string local_138;
  string local_118;
  string local_f8;
  place_order<hedg::Back> local_d0;
  
  this_00 = (this->client_)._M_t.
            super___uniq_ptr_impl<hedg::Client<hedg::Rest_Client>,_std::default_delete<hedg::Client<hedg::Rest_Client>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_hedg::Client<hedg::Rest_Client>_*,_std::default_delete<hedg::Client<hedg::Rest_Client>_>_>
            .super__Head_base<0UL,_hedg::Client<hedg::Rest_Client>_*,_false>._M_head_impl;
  pcVar1 = (this->session_id_)._M_dataplus._M_p;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar1,pcVar1 + (this->session_id_)._M_string_length);
  pcVar1 = (this->market_id_)._M_dataplus._M_p;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar1,pcVar1 + (this->market_id_)._M_string_length);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,config::place_order_endpoint_abi_cxx11_,
             DAT_001f8848 + config::place_order_endpoint_abi_cxx11_);
  params::place_order<hedg::Back>::place_order(&local_d0,&local_f8,&local_118,orders,&local_138);
  Client<hedg::Rest_Client>::
  send_request<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::place_order<hedg::Back>>
            (this_00,rest::message<hedg::params::place_order<hedg::Back>>,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.market_id._M_dataplus._M_p != &local_d0.market_id.field_2) {
    operator_delete(local_d0.market_id._M_dataplus._M_p,
                    local_d0.market_id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.session_id._M_dataplus._M_p != &local_d0.session_id.field_2) {
    operator_delete(local_d0.session_id._M_dataplus._M_p,
                    local_d0.session_id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.end_point._M_dataplus._M_p != &local_d0.end_point.field_2) {
    operator_delete(local_d0.end_point._M_dataplus._M_p,
                    local_d0.end_point.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void send_back_order(std::vector<Order>& orders) {
		try {
			client_->send_request(rest::message<params::place_order<Back> >,
				params::place_order<Back>(session_id_, market_id_, orders));
		}
		catch (boost::system::system_error e) {
			spdlog::error(e.what());
			spdlog::warn("Unable to send back order");
		}

	}